

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

int __thiscall
embree::Points::verify
          (Points *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  RawBufferView *pRVar3;
  long lVar4;
  size_t sVar5;
  iterator __begin1;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  size_t sVar9;
  
  sVar5 = (this->vertices).size_active;
  if (sVar5 != 0) {
    pBVar6 = (this->vertices).items;
    lVar4 = sVar5 * 0x38;
    pBVar1 = pBVar6 + sVar5;
    pBVar7 = pBVar6;
    do {
      if (lVar4 == 0) {
        sVar5 = (this->normals).size_active;
        if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
          if (sVar5 == 0) {
            return 0;
          }
          sVar5 = sVar5 * 0x38;
          pBVar8 = (this->normals).items;
          while (sVar5 != 0) {
            sVar5 = sVar5 - 0x38;
            pRVar3 = &pBVar8->super_RawBufferView;
            pBVar8 = pBVar8 + 1;
            if ((pBVar6->super_RawBufferView).num != pRVar3->num) {
              return 0;
            }
          }
        }
        else if (sVar5 != 0) {
          return 0;
        }
        do {
          if (pBVar6 == pBVar1) {
            return (int)CONCAT71((int7)(sVar5 >> 8),1);
          }
          sVar9 = 0;
          while ((pBVar6->super_RawBufferView).num != sVar9) {
            pcVar2 = (pBVar6->super_RawBufferView).ptr_ofs;
            lVar4 = (pBVar6->super_RawBufferView).stride * sVar9;
            if (1.844e+18 <= ABS(*(float *)(pcVar2 + lVar4))) {
              return 0;
            }
            if (1.844e+18 <= ABS(*(float *)(pcVar2 + lVar4 + 4))) {
              return 0;
            }
            if (1.844e+18 <= ABS(*(float *)(pcVar2 + lVar4 + 8))) {
              return 0;
            }
            sVar9 = sVar9 + 1;
            sVar5 = 0;
            if (1.844e+18 <= ABS(*(float *)(pcVar2 + lVar4 + 0xc))) {
              return 0;
            }
          }
          pBVar6 = pBVar6 + 1;
        } while( true );
      }
      pRVar3 = &pBVar7->super_RawBufferView;
      pBVar7 = pBVar7 + 1;
      lVar4 = lVar4 + -0x38;
    } while (pRVar3->num == (pBVar6->super_RawBufferView).num);
  }
  return 0;
}

Assistant:

__forceinline size_t size     () const { return size_active; }